

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_onewaycouple_mri.c
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  uint uVar2;
  N_Vector y;
  N_Vector ytrue;
  long lVar3;
  long lVar4;
  FILE *__s;
  char *pcVar5;
  int iVar6;
  N_Vector user_data;
  double dVar7;
  SUNContext ctx;
  sunrealtype t;
  MRIStepInnerStepper inner_stepper;
  sunrealtype error;
  long nff;
  long nfse;
  long nstf;
  long nsts;
  undefined8 local_98;
  sunrealtype local_90;
  undefined8 local_88;
  sunrealtype local_80;
  long local_78;
  sunrealtype local_70;
  double local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  long local_40;
  long local_38;
  
  local_88 = 0;
  local_80 = 0.0;
  local_98 = 0;
  uVar2 = SUNContext_Create(0);
  if ((int)uVar2 < 0) {
    pcVar5 = "SUNContext_Create";
  }
  else {
    puts("\nOne way coupling ODE test problem:");
    printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",0x3ff0000000000000,0,
           0x4000000000000000);
    printf("    hs = %g,  hf = %g\n\n",0x3f50624dd2f1a9fc,0x3f1a36e2eb1c432d);
    y = (N_Vector)N_VNew_Serial(3,local_98);
    if (y == (N_Vector)0x0) {
      main_cold_3();
      return 1;
    }
    puVar1 = *(undefined8 **)((long)y->content + 0x10);
    *puVar1 = 0x3ff0000000000000;
    puVar1[1] = 0;
    puVar1[2] = 0x4000000000000000;
    ytrue = (N_Vector)N_VClone(y);
    lVar3 = ARKStepCreate(0,ff,0,y,local_98);
    local_40 = lVar3;
    if (lVar3 == 0) {
      main_cold_2();
      return 1;
    }
    uVar2 = ARKStepSetTableNum(lVar3,0xffffffff,0xc);
    if ((int)uVar2 < 0) {
      pcVar5 = "ARKStepSetTableNum";
    }
    else {
      uVar2 = ARKodeSetFixedStep(0x3f1a36e2eb1c432d,lVar3);
      if (-1 < (int)uVar2) {
        uVar2 = ARKodeCreateMRIStepInnerStepper(lVar3,&local_88);
        if ((int)uVar2 < 0) {
          pcVar5 = "ARKodeCreateMRIStepInnerStepper";
          goto LAB_0010179b;
        }
        lVar4 = MRIStepCreate(0,fs,0,y,local_88,local_98);
        local_38 = lVar4;
        if (lVar4 == 0) {
          main_cold_1();
          return 1;
        }
        uVar2 = ARKodeSetFixedStep(0x3f50624dd2f1a9fc,lVar4);
        if (-1 < (int)uVar2) {
          local_78 = lVar3;
          __s = fopen("ark_onewaycouple_mri_solution.txt","w");
          fwrite("# t u v w maxerr\n",0x11,1,__s);
          puVar1 = *(undefined8 **)((long)y->content + 0x10);
          fprintf(__s," %.16e %.16e %.16e %.16e %.16e\n",0,*puVar1,puVar1[1],puVar1[2],0);
          local_90 = 0.0;
          puts("        t           u           v           w       max err");
          puts("   ----------------------------------------------------------");
          puVar1 = *(undefined8 **)((long)y->content + 0x10);
          printf("  %10.6f  %10.6f  %10.6f  %10.6f  %10.6f\n",0,*puVar1,puVar1[1],puVar1[2],0);
          dVar7 = 0.1;
          iVar6 = 10;
          do {
            user_data = y;
            local_68 = dVar7;
            uVar2 = ARKodeEvolve(lVar4,y,&local_90,1);
            if ((int)uVar2 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","ARKodeEvolve",
                      (ulong)uVar2);
              break;
            }
            ans(local_90,ytrue,user_data);
            err(y,ytrue,&local_80);
            puVar1 = *(undefined8 **)((long)y->content + 0x10);
            local_70 = local_80;
            printf("  %10.6f  %10.6f  %10.6f  %10.6f  %10.6f\n",local_90,*puVar1,puVar1[1],puVar1[2]
                  );
            puVar1 = *(undefined8 **)((long)y->content + 0x10);
            fprintf(__s," %.16e %.16e %.16e %.16e %.16e\n",local_90,*puVar1,puVar1[1],puVar1[2],
                    local_70);
            dVar7 = 1.0;
            if (local_68 + 0.1 <= 1.0) {
              dVar7 = local_68 + 0.1;
            }
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
          puts("   ----------------------------------------------------------");
          fclose(__s);
          uVar2 = ARKodeGetNumSteps(lVar4,&local_48);
          if ((int)uVar2 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","ARKodeGetNumSteps"
                    ,(ulong)uVar2);
          }
          uVar2 = ARKodeGetNumRhsEvals(lVar4,0,&local_58);
          lVar3 = local_78;
          if ((int)uVar2 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                    "ARKodeGetNumRhsEvals",(ulong)uVar2);
          }
          uVar2 = ARKodeGetNumSteps(lVar3,&local_50);
          if ((int)uVar2 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","ARKodeGetNumSteps"
                    ,(ulong)uVar2);
          }
          uVar2 = ARKodeGetNumRhsEvals(lVar3,0,&local_60);
          if ((int)uVar2 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                    "ARKodeGetNumRhsEvals",(ulong)uVar2);
          }
          puts("\nFinal Solver Statistics:");
          printf("   Steps: nsts = %li, nstf = %li\n",local_48,local_50);
          printf("   Total RHS evals:  Fs = %li,  Ff = %li\n",local_58,local_60);
          N_VDestroy(y);
          N_VDestroy(ytrue);
          ARKodeFree(&local_40);
          MRIStepInnerStepper_Free(&local_88);
          ARKodeFree(&local_38);
          SUNContext_Free(&local_98);
          return 0;
        }
      }
      pcVar5 = "ARKodeSetFixedStep";
    }
  }
LAB_0010179b:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar5,(ulong)uVar2);
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf    = SUN_RCONST(1.0);       /* final time */
  sunrealtype dTout = SUN_RCONST(0.1);       /* time between outputs */
  sunindextype NEQ  = 3;                     /* number of dependent vars. */
  int Nt            = (int)ceil(Tf / dTout); /* number of output times */
  sunrealtype hs    = SUN_RCONST(0.001);     /* slow step size */
  sunrealtype hf    = SUN_RCONST(0.0001);    /* fast step size */
  sunrealtype u0, v0, w0;                    /* initial conditions */

  /* general problem variables */
  int retval;                    /* reusable error-checking flag */
  N_Vector y             = NULL; /* empty vector for the computed solution */
  N_Vector ytrue         = NULL; /* empty vector for the analytic solution */
  void* arkode_mem       = NULL; /* empty ARKode memory structure */
  void* inner_arkode_mem = NULL; /* empty ARKode memory structure */
  MRIStepInnerStepper inner_stepper = NULL; /* inner stepper */
  FILE* UFID;
  sunrealtype t, tout;
  sunrealtype error = SUN_RCONST(0.0);
  int iout;
  long int nsts, nstf, nfse, nff;

  /*
   * Initialization
   */

  /* Create the SUNDIALS context object for this simulation. */
  SUNContext ctx = NULL;
  retval         = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Set the initial contions */
  u0 = SUN_RCONST(1.0);
  v0 = SUN_RCONST(0.0);
  w0 = SUN_RCONST(2.0);

  /* Initial problem output */
  printf("\nOne way coupling ODE test problem:\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);
  printf("    hs = %" GSYM ",  hf = %" GSYM "\n\n", hs, hf);

  /* Create and initialize serial vector for the solution */
  y = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }

  NV_Ith_S(y, 0) = u0;
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  /* Create serial vector for the analytic solution */
  ytrue = N_VClone(y);

  /*
   * Create the fast integrator and set options
   */

  /* Initialize the fast integrator. Specify the explicit fast right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the initial time T0, and the
     initial dependent variable vector y. */
  inner_arkode_mem = ARKStepCreate(ff, NULL, T0, y, ctx);
  if (check_retval((void*)inner_arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set the fast method */
  retval = ARKStepSetTableNum(inner_arkode_mem, -1, ARKODE_KNOTH_WOLKE_3_3);
  if (check_retval(&retval, "ARKStepSetTableNum", 1)) { return 1; }

  /* Set the fast step size */
  retval = ARKodeSetFixedStep(inner_arkode_mem, hf);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create inner stepper */
  retval = ARKodeCreateMRIStepInnerStepper(inner_arkode_mem, &inner_stepper);
  if (check_retval(&retval, "ARKodeCreateMRIStepInnerStepper", 1)) { return 1; }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the slow integrator. Specify the explicit slow right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the initial time T0, the
     initial dependent variable vector y, and the fast integrator. */
  arkode_mem = MRIStepCreate(fs, NULL, T0, y, inner_stepper, ctx);
  if (check_retval((void*)arkode_mem, "MRIStepCreate", 0)) { return 1; }

  /* Set the slow step size */
  retval = ARKodeSetFixedStep(arkode_mem, hs);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /*
   * Integrate ODE
   */

  /* Open output stream for results, output comment line */
  UFID = fopen("ark_onewaycouple_mri_solution.txt", "w");
  fprintf(UFID, "# t u v w maxerr\n");

  /* output initial condition to disk */
  fprintf(UFID,
          " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n",
          T0, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2), error);

  /* Main time-stepping loop: calls ARKodeEvolve to perform the
     integration, then prints results. Stops when the final time
     has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u           v           w       max err\n");
  printf("   ----------------------------------------------------------\n");
  printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM
         "  %10.6" FSYM "\n",
         t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2), error);

  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }

    /* compute the analytic solution */
    retval = ans(t, ytrue, NULL);
    if (check_retval(&retval, "ans", 1)) { break; }

    /* compute the error compared to the analytic solution */
    retval = err(y, ytrue, &error);
    if (check_retval(&retval, "err", 1)) { break; }

    /* access/print solution and error */
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM
           "  %10.6" FSYM "\n",
           t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2), error);
    fprintf(UFID,
            " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n",
            t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2), error);

    /* successful solve: update time */
    tout += dTout;
    tout = (tout > Tf) ? Tf : tout;
  }
  printf("   ----------------------------------------------------------\n");
  fclose(UFID);

  /*
   * Finalize
   */

  /* Get some slow integrator statistics */
  retval = ARKodeGetNumSteps(arkode_mem, &nsts);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumRhsEvals(arkode_mem, 0, &nfse);
  check_retval(&retval, "ARKodeGetNumRhsEvals", 1);

  /* Get some fast integrator statistics */
  retval = ARKodeGetNumSteps(inner_arkode_mem, &nstf);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumRhsEvals(inner_arkode_mem, 0, &nff);
  check_retval(&retval, "ARKodeGetNumRhsEvals", 1);

  /* Print some final statistics */
  printf("\nFinal Solver Statistics:\n");
  printf("   Steps: nsts = %li, nstf = %li\n", nsts, nstf);
  printf("   Total RHS evals:  Fs = %li,  Ff = %li\n", nfse, nff);

  /* Clean up and return */
  N_VDestroy(y);                            /* Free y vector */
  N_VDestroy(ytrue);                        /* Free ytrue vector */
  ARKodeFree(&inner_arkode_mem);            /* Free integrator memory */
  MRIStepInnerStepper_Free(&inner_stepper); /* Free inner stepper */
  ARKodeFree(&arkode_mem);                  /* Free integrator memory */
  SUNContext_Free(&ctx);                    /* Free context */

  return 0;
}